

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.hpp
# Opt level: O1

HVector * __thiscall Basis::vec2hvec(Basis *this,QpVector *vec)

{
  pointer piVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer pdVar4;
  long lVar5;
  int iVar6;
  
  HVectorBase<double>::clear(&this->buffer_vec2hvec);
  iVar6 = vec->num_nz;
  if (0 < iVar6) {
    piVar1 = (vec->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (vec->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->buffer_vec2hvec).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->buffer_vec2hvec).array.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      piVar3[lVar5] = piVar1[lVar5];
      iVar6 = piVar1[lVar5];
      pdVar4[iVar6] = pdVar2[iVar6];
      lVar5 = lVar5 + 1;
      iVar6 = vec->num_nz;
    } while (lVar5 < iVar6);
  }
  (this->buffer_vec2hvec).count = iVar6;
  (this->buffer_vec2hvec).packFlag = true;
  return &this->buffer_vec2hvec;
}

Assistant:

HVector& vec2hvec(const QpVector& vec) {
    buffer_vec2hvec.clear();
    for (HighsInt i = 0; i < vec.num_nz; i++) {
      buffer_vec2hvec.index[i] = vec.index[i];
      buffer_vec2hvec.array[vec.index[i]] = vec.value[vec.index[i]];
    }
    buffer_vec2hvec.count = vec.num_nz;
    buffer_vec2hvec.packFlag = true;
    return buffer_vec2hvec;
  }